

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::GLMClassifier::InternalSwap(GLMClassifier *this,GLMClassifier *other)

{
  uint32_t uVar1;
  intptr_t iVar2;
  ClassLabelsUnion CVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::InternalSwap
            (&this->weights_,&other->weights_);
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar7 = (this->offset_).current_size_;
  iVar8 = (this->offset_).total_size_;
  pvVar4 = (this->offset_).arena_or_elements_;
  iVar6 = (other->offset_).total_size_;
  pvVar5 = (other->offset_).arena_or_elements_;
  (this->offset_).current_size_ = (other->offset_).current_size_;
  (this->offset_).total_size_ = iVar6;
  (this->offset_).arena_or_elements_ = pvVar5;
  (other->offset_).current_size_ = iVar7;
  (other->offset_).total_size_ = iVar8;
  (other->offset_).arena_or_elements_ = pvVar4;
  iVar7 = this->postevaluationtransform_;
  iVar8 = this->classencoding_;
  iVar6 = other->classencoding_;
  this->postevaluationtransform_ = other->postevaluationtransform_;
  this->classencoding_ = iVar6;
  other->postevaluationtransform_ = iVar7;
  other->classencoding_ = iVar8;
  CVar3 = this->ClassLabels_;
  this->ClassLabels_ = other->ClassLabels_;
  other->ClassLabels_ = CVar3;
  uVar1 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar1;
  return;
}

Assistant:

void GLMClassifier::InternalSwap(GLMClassifier* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  weights_.InternalSwap(&other->weights_);
  offset_.InternalSwap(&other->offset_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(GLMClassifier, classencoding_)
      + sizeof(GLMClassifier::classencoding_)
      - PROTOBUF_FIELD_OFFSET(GLMClassifier, postevaluationtransform_)>(
          reinterpret_cast<char*>(&postevaluationtransform_),
          reinterpret_cast<char*>(&other->postevaluationtransform_));
  swap(ClassLabels_, other->ClassLabels_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}